

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O2

matches * atomrimm_a(iasctx *ctx,void *v,int spos)

{
  match *res;
  int iVar1;
  matches *__ptr;
  
  if ((ctx->atomsnum != spos) && (ctx->atoms[spos]->type == LITEM_EXPR)) {
    __ptr = alwaysmatches(spos + 1);
    res = __ptr->m;
    iVar1 = setrbf(res,(rbitfield *)v,ctx->atoms[spos]->expr);
    if (iVar1 != 0) {
      return __ptr;
    }
    free(res);
    free(__ptr);
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomrimm_a APROTO {
	const struct rbitfield *bf = v;
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct matches *res = alwaysmatches(spos+1);
	if (setrbf(res->m, bf, ctx->atoms[spos]->expr))
		return res;
	else {
		free(res->m);
		free(res);
		return 0;
	}
}